

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos65xx.cc
# Opt level: O1

void __thiscall
chipemu::implementation::implementation_6500_with_IO::pin_read(implementation_6500_with_IO *this)

{
  uint in_ESI;
  
  pin_read((implementation_6500_with_IO *)
           (&(this->super_implementation_6500).super_nmos.field_0x0 +
           *(long *)(*(long *)&(this->super_implementation_6500).super_nmos + -0x60)),in_ESI);
  return;
}

Assistant:

virtual bool pin_read(unsigned index) const noexcept final
    {
        if (index > 0 and index <= pin_count()) {
            node_id id = pinout[index - 1];

            if (id == aec_node_id)
            {
                return is_aec_high;
            }
            else if (id >= ioport_id_0 and id <= ioport_id_7) {
                unsigned port_index = id - ioport_id_0;

                if (iodirs & (1 << port_index)) {
                    return (ioports & (1 << port_index)) != 0;
                }
                else {
                    return false;
                }
            }
            else {
                return get_node(id);
            }
        }
        else {
            return false;
        }
    }